

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O0

bool __thiscall
dxil_spv::CFGStructurizer::control_flow_is_escaping_from_loop
          (CFGStructurizer *this,CFGNode *node,CFGNode *merge)

{
  CFGNode *other;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  CFGNode *this_00;
  reference ppCVar7;
  bool frontier_is_inside_loop_construct;
  bool header_dominates_frontier;
  CFGNode *frontier;
  const_iterator __end2;
  const_iterator __begin2;
  Vector<CFGNode_*> *__range2;
  bool pdf_can_reach_continue;
  bool continue_can_reach;
  bool can_reach_continue;
  bool dominates_merge;
  CFGNode *innermost_loop_header;
  bool escaping_path;
  CFGNode *merge_local;
  CFGNode *node_local;
  CFGStructurizer *this_local;
  
  this_local._7_1_ = false;
  if (node == merge) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = CFGNode::post_dominates(merge,node);
    if (!bVar1) {
      __assert_fail("merge->post_dominates(node)",
                    "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/cfg_structurizer.cpp"
                    ,0xbc5,
                    "bool dxil_spv::CFGStructurizer::control_flow_is_escaping_from_loop(const CFGNode *, const CFGNode *) const"
                   );
    }
    this_00 = get_innermost_loop_header_for(this,node);
    if ((this_00 != (CFGNode *)0x0) && (this_00->pred_back_edge != (CFGNode *)0x0)) {
      bVar2 = CFGNode::dominates(node,merge);
      bVar3 = query_reachability(this,node,this_00->pred_back_edge);
      bVar4 = query_reachability(this,this_00->pred_back_edge,node);
      bVar1 = true;
      __end2 = std::
               vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
               begin(&node->post_dominance_frontier);
      frontier = (CFGNode *)
                 std::
                 vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>::
                 end(&node->post_dominance_frontier);
      while (bVar5 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                                         *)&frontier), bVar5) {
        ppCVar7 = __gnu_cxx::
                  __normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
                  ::operator*(&__end2);
        other = *ppCVar7;
        bVar5 = CFGNode::dominates(this_00,other);
        bVar6 = query_reachability(this,other,this_00->pred_back_edge);
        if ((!bVar5) || (!bVar6)) {
          bVar1 = false;
          break;
        }
        __gnu_cxx::
        __normal_iterator<dxil_spv::CFGNode_*const_*,_std::vector<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>_>
        ::operator++(&__end2);
      }
      if ((((!bVar2) && (!bVar4)) && (!bVar3)) && (bVar1)) {
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CFGStructurizer::control_flow_is_escaping_from_loop(const CFGNode *node, const CFGNode *merge) const
{
	bool escaping_path = false;

	if (node == merge)
		return escaping_path;

	assert(merge->post_dominates(node));

	// First, test the loop scenario.
	// If we're inside a loop, we're a break construct if we can prove that:
	// - node has a loop header which dominates it.
	// - node cannot reach the continue block.
	// - Continue block cannot reach node.
	// - All post-domination frontiers can reach the continue block, meaning that at some point control flow
	//   decided to break out of the loop construct.
	auto *innermost_loop_header = get_innermost_loop_header_for(node);
	if (innermost_loop_header && innermost_loop_header->pred_back_edge)
	{
		bool dominates_merge = node->dominates(merge);
		bool can_reach_continue = query_reachability(*node, *innermost_loop_header->pred_back_edge);
		bool continue_can_reach = query_reachability(*innermost_loop_header->pred_back_edge, *node);
		bool pdf_can_reach_continue = true;

		for (auto *frontier : node->post_dominance_frontier)
		{
			bool header_dominates_frontier = innermost_loop_header->dominates(frontier);
			bool frontier_is_inside_loop_construct =
				query_reachability(*frontier, *innermost_loop_header->pred_back_edge);
			if (!header_dominates_frontier || !frontier_is_inside_loop_construct)
			{
				pdf_can_reach_continue = false;
				break;
			}
		}

		if (!dominates_merge && !continue_can_reach && !can_reach_continue && pdf_can_reach_continue)
			escaping_path = true;
	}

	return escaping_path;
}